

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cc
# Opt level: O1

int MD5_Final(uchar *md,MD5_CTX *c)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar2 = c->num;
  uVar5 = (ulong)uVar2;
  if (uVar5 < 0x40) {
    puVar1 = c->data;
    uVar3 = c->Nl;
    uVar4 = c->Nh;
    *(undefined1 *)((long)puVar1 + uVar5) = 0x80;
    lVar6 = uVar5 + 1;
    if (0x37 < uVar2) {
      if (uVar2 != 0x3f) {
        memset((void *)(lVar6 + (long)puVar1),0,0x3f - uVar5);
      }
      md5_block_asm_data_order(c,puVar1,1);
      lVar6 = 0;
    }
    if (lVar6 != 0x38) {
      memset((void *)(lVar6 + (long)puVar1),0,0x38 - lVar6);
    }
    c->data[0xe] = uVar3;
    c->data[0xf] = uVar4;
    md5_block_asm_data_order(c,puVar1,1);
    c->data[0xc] = 0;
    c->data[0xd] = 0;
    c->data[0xe] = 0;
    c->data[0xf] = 0;
    c->data[8] = 0;
    c->data[9] = 0;
    c->data[10] = 0;
    c->data[0xb] = 0;
    c->data[4] = 0;
    c->data[5] = 0;
    c->data[6] = 0;
    c->data[7] = 0;
    puVar1[0] = 0;
    puVar1[1] = 0;
    c->data[2] = 0;
    c->data[3] = 0;
    c->num = 0;
    *(uint *)md = c->A;
    *(uint *)(md + 4) = c->B;
    *(uint *)(md + 8) = c->C;
    *(uint *)(md + 0xc) = c->D;
    return 1;
  }
  __assert_fail("n < block_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/md5/../fipsmodule/digest/md32_common.h"
                ,0x83,
                "void crypto_md32_final(crypto_md32_block_func, uint32_t *, uint8_t *, size_t, unsigned int *, uint32_t, uint32_t, int)"
               );
}

Assistant:

int MD5_Final(uint8_t out[MD5_DIGEST_LENGTH], MD5_CTX *c) {
  crypto_md32_final(&md5_block_data_order, c->h, c->data, MD5_CBLOCK, &c->num,
                    c->Nh, c->Nl, /*is_big_endian=*/0);

  CRYPTO_store_u32_le(out, c->h[0]);
  CRYPTO_store_u32_le(out + 4, c->h[1]);
  CRYPTO_store_u32_le(out + 8, c->h[2]);
  CRYPTO_store_u32_le(out + 12, c->h[3]);
  return 1;
}